

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

void __thiscall rr::pa::TriangleAdjacency::TriangleAdjacency(TriangleAdjacency *this)

{
  TriangleAdjacency *this_local;
  
  this->v0 = (VertexPacket *)0x0;
  this->v1 = (VertexPacket *)0x0;
  this->v2 = (VertexPacket *)0x0;
  this->v3 = (VertexPacket *)0x0;
  this->v4 = (VertexPacket *)0x0;
  this->v5 = (VertexPacket *)0x0;
  this->provokingIndex = -1;
  return;
}

Assistant:

TriangleAdjacency (void)
		: v0				(DE_NULL)
		, v1				(DE_NULL)
		, v2				(DE_NULL)
		, v3				(DE_NULL)
		, v4				(DE_NULL)
		, v5				(DE_NULL)
		, provokingIndex	(-1)
	{
	}